

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O0

int main(void)

{
  Input *this;
  double dVar1;
  ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
  modules;
  ModuleGroup<chains::SplitProcessor,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  modules_00;
  ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
  modules_1;
  ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>
  modules_1_00;
  int iVar2;
  Input **ppIVar3;
  Value<chains::gain::Gain> *values;
  Value<chains::gain::Gain> *values_00;
  Value<chains::gain::Gain> *values_01;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffec8;
  double local_128;
  ebo<boost::hana::detail::bti<0UL>,_chains::Input_*,_false> local_120;
  Input *local_118;
  Input *fade;
  SerialProcessor<double,_boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
  processor;
  ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>
  local_f0;
  Value<chains::gain::Gain> local_d0;
  char *local_c8;
  double local_c0;
  char *local_b8;
  Value<chains::gain::Gain> local_b0;
  ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
  local_a8;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  ModuleGroup<chains::SerialProcessor,_chains::ModuleGroup<chains::SplitProcessor,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>,_chains::ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>_>
  chain;
  
  chain.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleGroup<chains::SplitProcessor,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>,_chains::ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>_>
  .
  super_ebo<boost::hana::detail::bti<1UL>,_chains::ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>,_false>
  .data_.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::crossfade::Fade>_>.
  super__Head_base<0UL,_chains::Parameter<chains::crossfade::Fade>,_false>._M_head_impl.moduleName_.
  _4_4_ = 0;
  chains::Value<chains::gain::Gain>::Value(&local_b0,1.0);
  chains::module<chains::gain::Module,chains::Expose<>,chains::Value<chains::gain::Gain>>
            (&local_a8,(chains *)&local_b0,values);
  chains::Value<chains::gain::Gain>::Value(&local_d0,2.0);
  chains::module<chains::gain::Module,chains::Expose<>,chains::Value<chains::gain::Gain>>
            ((ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>
              *)&local_c8,(chains *)&local_d0,values_00);
  modules.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.defaultValue_ =
       (double)local_a8.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
               super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.
               moduleName_;
  modules._0_8_ =
       local_a8.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
       super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.
       defaultValue_;
  modules.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.moduleName_ =
       local_c8;
  modules_1.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.defaultValue_ =
       (double)local_b8;
  modules_1._0_8_ = local_c0;
  modules_1.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.moduleName_ =
       in_stack_fffffffffffffea8;
  chains::
  split<chains::ModuleHost<chains::gain::Module,std::tuple<chains::Parameter<chains::gain::Gain>>,chains::Expose<>>,chains::ModuleHost<chains::gain::Module,std::tuple<chains::Parameter<chains::gain::Gain>>,chains::Expose<>>>
            (modules,modules_1);
  chains::Value<chains::crossfade::Fade>::Value
            ((Value<chains::crossfade::Fade> *)
             &processor.
              super_ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
              .processors_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>
              .
              super_ebo<boost::hana::detail::bti<1UL>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>,_false>
             ,0.5);
  chains::
  module<chains::crossfade::Module,chains::Expose<chains::crossfade::Fade>,chains::Value<chains::crossfade::Fade>>
            (&local_f0,
             (chains *)
             &processor.
              super_ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
              .processors_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>
              .
              super_ebo<boost::hana::detail::bti<1UL>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>,_false>
             ,values_01);
  modules_00.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_false>
  .data_.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.defaultValue_ =
       (double)local_80;
  modules_00.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_false>
  .data_._0_8_ = uStack_88;
  modules_00.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  .
  super_ebo<boost::hana::detail::bti<0UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_false>
  .data_.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.moduleName_ =
       (char *)uStack_78;
  modules_00.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  .
  super_ebo<boost::hana::detail::bti<1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_false>
  .data_._0_8_ = local_70;
  modules_00.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  .
  super_ebo<boost::hana::detail::bti<1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_false>
  .data_.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.defaultValue_ =
       (double)uStack_68;
  modules_00.modules_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>
  .
  super_ebo<boost::hana::detail::bti<1UL>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_false>
  .data_.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::gain::Gain>_>.
  super__Head_base<0UL,_chains::Parameter<chains::gain::Gain>,_false>._M_head_impl.moduleName_ =
       (char *)local_f0.exposed_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::Parameter<chains::crossfade::Fade>_>
               .
               super_ebo<boost::hana::detail::bti<0UL>,_chains::Parameter<chains::crossfade::Fade>,_false>
               .data_.defaultValue_;
  modules_1_00.exposed_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::Parameter<chains::crossfade::Fade>_>
  .super_ebo<boost::hana::detail::bti<0UL>,_chains::Parameter<chains::crossfade::Fade>,_false>.data_
  .moduleName_ = (char *)local_f0.parameters_.
                         super__Tuple_impl<0UL,_chains::Parameter<chains::crossfade::Fade>_>.
                         super__Head_base<0UL,_chains::Parameter<chains::crossfade::Fade>,_false>.
                         _M_head_impl.defaultValue_;
  modules_1_00.exposed_.storage_.
  super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::Parameter<chains::crossfade::Fade>_>
  .super_ebo<boost::hana::detail::bti<0UL>,_chains::Parameter<chains::crossfade::Fade>,_false>.data_
  .defaultValue_ =
       (double)local_f0.exposed_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::Parameter<chains::crossfade::Fade>_>
               .
               super_ebo<boost::hana::detail::bti<0UL>,_chains::Parameter<chains::crossfade::Fade>,_false>
               .data_.moduleName_;
  modules_1_00.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::crossfade::Fade>_>.
  super__Head_base<0UL,_chains::Parameter<chains::crossfade::Fade>,_false>._M_head_impl.
  defaultValue_ =
       (double)local_f0.parameters_.
               super__Tuple_impl<0UL,_chains::Parameter<chains::crossfade::Fade>_>.
               super__Head_base<0UL,_chains::Parameter<chains::crossfade::Fade>,_false>._M_head_impl
               .moduleName_;
  modules_1_00.parameters_.super__Tuple_impl<0UL,_chains::Parameter<chains::crossfade::Fade>_>.
  super__Head_base<0UL,_chains::Parameter<chains::crossfade::Fade>,_false>._M_head_impl.moduleName_
       = in_stack_fffffffffffffec8;
  chains::
  serial<chains::ModuleGroup<chains::SplitProcessor,chains::ModuleHost<chains::gain::Module,std::tuple<chains::Parameter<chains::gain::Gain>>,chains::Expose<>>,chains::ModuleHost<chains::gain::Module,std::tuple<chains::Parameter<chains::gain::Gain>>,chains::Expose<>>>,chains::ModuleHost<chains::crossfade::Module,std::tuple<chains::Parameter<chains::crossfade::Fade>>,chains::Expose<chains::crossfade::Fade>>>
            (modules_00,modules_1_00);
  chains::
  ModuleGroup<chains::SerialProcessor,_chains::ModuleGroup<chains::SplitProcessor,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>,_chains::ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>_>
  ::makeProcessor<double>
            ((SerialProcessor<double,_boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
              *)&fade,(ModuleGroup<chains::SerialProcessor,_chains::ModuleGroup<chains::SplitProcessor,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>,_chains::ModuleHost<chains::gain::Module,_std::tuple<chains::Parameter<chains::gain::Gain>_>,_chains::Expose<>_>_>,_chains::ModuleHost<chains::crossfade::Module,_std::tuple<chains::Parameter<chains::crossfade::Fade>_>,_chains::Expose<chains::crossfade::Fade>_>_>
                       *)local_60,44100.0);
  local_120.data_ =
       (Input *)chains::
                ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
                ::exposedInputs((ProcessorGroup<boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
                                 *)&fade);
  ppIVar3 = boost::hana::at_c<0ul,chains::Input*>((tuple<chains::Input_*> *)&local_120);
  this = *ppIVar3;
  local_118 = this;
  iVar2 = rand();
  chains::Input::setValue(this,(double)(iVar2 / 0x7fffffff));
  iVar2 = rand();
  local_128 = (double)(iVar2 / 0x7fffffff);
  dVar1 = chains::
          SerialProcessor<double,_boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
          ::tick((SerialProcessor<double,_boost::hana::tuple<chains::SplitProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_chains::ProcessorHost<chains::gain::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::gain::Gain,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::gain::Gain>::_,_chains::Constant>_>_>_>_>_>,_chains::ProcessorHost<chains::crossfade::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::crossfade::Fade,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::crossfade::Fade>::_,_chains::Input>_>_>,_chains::Parameter<chains::crossfade::Fade>_>_>_>
                  *)&fade,&local_128);
  return (int)dVar1;
}

Assistant:

int main()
{
  using namespace chains;

  const auto chain =
    serial(split(module<Gain>(Value<gain::Gain>(1)), module<Gain>(Value<gain::Gain>(2))),
           module<Crossfade, Expose<crossfade::Fade>>(Value<crossfade::Fade>(0.5)));

  auto processor = chain.makeProcessor<double>(44100);
  auto fade = boost::hana::at_c<0>(processor.exposedInputs());

  fade->setValue(rand() / RAND_MAX);

  return processor.tick(rand() / RAND_MAX);
}